

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThread.cc
# Opt level: O0

void __thiscall tt::net::EventLoopThread::EventLoopThread(EventLoopThread *this)

{
  allocator local_81;
  string local_80;
  EventLoopThread *local_60;
  code *local_58;
  undefined8 local_50;
  type local_48;
  ThreadFunc local_30;
  EventLoopThread *local_10;
  EventLoopThread *this_local;
  
  this->m_loop = (EventLoop *)0x0;
  this->m_exiting = false;
  local_58 = threadFunc;
  local_50 = 0;
  local_60 = this;
  local_10 = this;
  std::bind<void(tt::net::EventLoopThread::*)(),tt::net::EventLoopThread*>
            (&local_48,(offset_in_EventLoopThread_to_subr *)&local_58,&local_60);
  std::function<void()>::
  function<std::_Bind<void(tt::net::EventLoopThread::*(tt::net::EventLoopThread*))()>,void>
            ((function<void()> *)&local_30,&local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"EventLoopThread",&local_81);
  Thread::Thread(&this->m_thread,&local_30,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::function<void_()>::~function(&local_30);
  MutexLock::MutexLock(&this->m_mutex);
  Condition::Condition(&this->m_cond,&this->m_mutex);
  return;
}

Assistant:

EventLoopThread::EventLoopThread()
	:m_loop(NULL),
	m_exiting(false), //是否退出
	m_thread(std::bind(&EventLoopThread::threadFunc,this), "EventLoopThread"),
	m_mutex(),
	m_cond(m_mutex){
	
	
}